

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O0

int run_many_negation_range_tests_simpler(_Bool inplace)

{
  int span;
  int r_start;
  int start_offset;
  int k;
  int h;
  undefined1 in_stack_00010033;
  int in_stack_00010034;
  int in_stack_00010038;
  int in_stack_0001003c;
  int in_stack_00010040;
  int in_stack_00010044;
  int local_18;
  int local_14;
  int local_10;
  uint local_c;
  uint local_8;
  
  for (local_8 = 1; (int)local_8 < 100; local_8 = local_8 * 3) {
    printf("h=%d\n",(ulong)local_8);
    for (local_c = local_8 + 1; (int)local_c < 100;
        local_c = (uint)((double)(int)local_c * 1.5 + 1.0)) {
      printf("  k=%d\n",(ulong)local_c);
      for (local_10 = 0; local_10 < 1000; local_10 = (int)((double)local_10 * 2.7 + 1.0)) {
        for (local_14 = 0; local_14 < 0xffff; local_14 = local_14 + 0x271d) {
          for (local_18 = 0; local_14 + local_18 < 0x10000; local_18 = local_18 * 3 + 1) {
            run_negation_range_tests_simpler
                      (in_stack_00010044,in_stack_00010040,in_stack_0001003c,in_stack_00010038,
                       in_stack_00010034,(_Bool)in_stack_00010033);
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

static int run_many_negation_range_tests_simpler(bool inplace) {
    for (int h = 1; h < 100; h *= 3) {
        printf("h=%d\n", h);
        for (int k = h + 1; k < 100; k = k * 1.5 + 1) {
            printf("  k=%d\n", k);
            for (int start_offset = 0; start_offset < 1000;
                 start_offset = start_offset * 2.7 + 1) {
                for (int r_start = 0; r_start < 65535; r_start += 10013)
                    for (int span = 0; r_start + span < 65536;
                         span = span * 3 + 1) {
                        run_negation_range_tests_simpler(
                            k, h, start_offset, r_start, r_start + span,
                            inplace);
                    }
            }
        }
    }
    return 1;
}